

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_tga(char *filename,int x,int y,int comp,void *data)

{
  uint alpha;
  undefined4 uVar1;
  int iVar2;
  int local_64;
  bool local_5d;
  int format;
  int colorbytes;
  int has_alpha;
  void *data_local;
  int comp_local;
  int y_local;
  int x_local;
  char *filename_local;
  
  local_5d = comp == 2 || comp == 4;
  alpha = (uint)local_5d;
  local_64 = comp;
  if (alpha != 0) {
    local_64 = comp + -1;
  }
  uVar1 = 2;
  if (local_64 < 2) {
    uVar1 = 3;
  }
  iVar2 = outfile(filename,-1,-1,x,y,comp,0,data,alpha,0,"111 221 2222 11",0,0,uVar1,0,0,0,0,0,x,y,
                  (local_64 + alpha) * 8,alpha << 3);
  return iVar2;
}

Assistant:

int stbi_write_tga(char const *filename, int x, int y, int comp, const void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3
   return outfile(filename, -1,-1, x, y, comp, 0, (void *) data, has_alpha, 0,
                  "111 221 2222 11", 0,0,format, 0,0,0, 0,0,x,y, (colorbytes+has_alpha)*8, has_alpha*8);
}